

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void rcg::convYCbCr411toQuadRGB(uint8_t *rgb,uint8_t *row,int i)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  uchar *in_RDI;
  int j;
  int bc;
  int gc;
  int rc;
  int Cr;
  int Cb;
  int Y [4];
  int local_40;
  uint local_28 [5];
  int local_14;
  uchar *local_8;
  
  local_14 = (in_EDX >> 2) * 6;
  local_28[0] = (uint)*(byte *)(in_RSI + local_14);
  local_28[1] = (uint)*(byte *)(in_RSI + (local_14 + 1));
  local_28[2] = (uint)*(byte *)(in_RSI + (local_14 + 3));
  local_28[3] = (uint)*(byte *)(in_RSI + (local_14 + 4));
  iVar3 = *(byte *)(in_RSI + (local_14 + 2)) - 0x80;
  iVar4 = *(byte *)(in_RSI + (local_14 + 5)) - 0x80;
  local_8 = in_RDI;
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    uVar2 = anon_unknown_4::clamp8(local_28[local_40] + (iVar4 * 0x5a + 0x4020 >> 6) + -0x100);
    puVar1 = local_8;
    local_8 = local_8 + 1;
    *puVar1 = uVar2;
    uVar2 = anon_unknown_4::clamp8
                      (local_28[local_40] + (iVar3 * -0x16 + iVar4 * -0x2e + 0x4020 >> 6) + -0x100);
    puVar1 = local_8;
    local_8 = local_8 + 1;
    *puVar1 = uVar2;
    uVar2 = anon_unknown_4::clamp8(local_28[local_40] + (iVar3 * 0x71 + 0x4020 >> 6) + -0x100);
    puVar1 = local_8;
    local_8 = local_8 + 1;
    *puVar1 = uVar2;
  }
  return;
}

Assistant:

void convYCbCr411toQuadRGB(uint8_t rgb[12], const uint8_t *row, int i)
{
  i=(i>>2)*6;

  const int Y[4]={row[i], row[i+1], row[i+3], row[i+4]};
  const int Cb=static_cast<int>(row[i+2])-128;
  const int Cr=static_cast<int>(row[i+5])-128;

  // conversion of YCbCr into RGB with correct rounding
  const int rc=((90*Cr+16384+32)>>6)-256;
  const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
  const int bc=((113*Cb+16384+32)>>6)-256;

  for (int j=0; j<4; j++)
  {
    *rgb++=clamp8(Y[j]+rc);
    *rgb++=clamp8(Y[j]+gc);
    *rgb++=clamp8(Y[j]+bc);
  }
}